

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

bool anon_unknown.dwarf_28eb6::useLocaltime(string *format)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__lhs;
  reference pcVar2;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  bool placeholder;
  undefined7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [2];
  bool local_11;
  
  local_11 = false;
  local_28[0]._M_current = (char *)std::__cxx11::string::begin();
  __lhs = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (!bVar1) {
      return true;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_28);
    in_stack_ffffffffffffffcf = *pcVar2;
    if ((local_11 & 1U) == 0) {
      local_11 = in_stack_ffffffffffffffcf == '%';
    }
    else {
      if (in_stack_ffffffffffffffcf == 'd') {
        return true;
      }
      if (in_stack_ffffffffffffffcf == 'u') {
        return false;
      }
      local_11 = false;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_28);
  } while( true );
}

Assistant:

bool useLocaltime(const std::string& format)
{
  bool placeholder = false;
  for (char c : format)
  {
    if (placeholder)
    {
      if (c == 'd') { return true; }
      if (c == 'u') { return false; }
      placeholder = false;
    }
    else
    {
      placeholder = (c == '%');
    }
  }
  return true;
}